

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* reduce_rows_cols(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *__return_storage_ptr__,
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *mtrx,tuple<int,_int> *tpl)

{
  __tuple_element_t<0UL,_tuple<int,_int>_> *p_Var1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  __tuple_element_t<1UL,_tuple<int,_int>_> *p_Var5;
  undefined4 local_28;
  undefined4 local_24;
  int i;
  int j;
  tuple<int,_int> *tpl_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *mtrx_local;
  
  local_24 = 0;
  while( true ) {
    p_Var1 = std::get<0ul,int,int>(tpl);
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](mtrx,(long)(*p_Var1 + -1));
    sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
    if (sVar3 <= (ulong)(long)local_24) break;
    p_Var1 = std::get<0ul,int,int>(tpl);
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](mtrx,(long)(*p_Var1 + -1));
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_24);
    *pvVar4 = NAN;
    local_24 = local_24 + 1;
  }
  local_28 = 0;
  while( true ) {
    sVar3 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(mtrx);
    if (sVar3 <= (ulong)(long)local_28) break;
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](mtrx,(long)local_28);
    p_Var5 = std::get<1ul,int,int>(tpl);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)(*p_Var5 + -1));
    *pvVar4 = NAN;
    local_28 = local_28 + 1;
  }
  p_Var5 = std::get<1ul,int,int>(tpl);
  pvVar2 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](mtrx,(long)(*p_Var5 + -1));
  p_Var1 = std::get<0ul,int,int>(tpl);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)(*p_Var1 + -1));
  *pvVar4 = NAN;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,mtrx);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<double>> reduce_rows_cols(std::vector<std::vector<double>> &mtrx, std::tuple<int,int> &tpl){
    for(int j=0; j< mtrx[std::get<0>(tpl)-1].size(); j++){
        mtrx[std::get<0>(tpl)-1][j] = INF;
    }
    for(int i =0; i<mtrx.size();i++){
        mtrx[i][std::get<1>(tpl)-1] = INF;
    }
    mtrx[std::get<1>(tpl)-1][std::get<0>(tpl)-1] = INF;
    return mtrx;
}